

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O0

State __thiscall QAccessibleTableCell::state(QAccessibleTableCell *this)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  Int IVar4;
  SelectionMode SVar5;
  ulong uVar6;
  QItemSelectionModel *pQVar7;
  QTreeView *this_00;
  QAbstractItemModel *pQVar8;
  long *in_RDI;
  long in_FS_OFFSET;
  QTreeView *treeView;
  ItemFlags flags;
  QRect globalRect;
  State st;
  QVariant checkState;
  QModelIndex *in_stack_fffffffffffffee8;
  QModelIndex *in_stack_fffffffffffffef0;
  QPoint *in_stack_fffffffffffffef8;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  undefined1 uVar9;
  QWidget *in_stack_ffffffffffffff08;
  QPersistentModelIndex local_d0 [3];
  QPersistentModelIndex local_b8 [3];
  QFlagsStorageHelper<Qt::ItemFlag,_4> local_9c;
  QFlagsStorageHelper<Qt::ItemFlag,_4> local_98;
  undefined4 local_94;
  QPersistentModelIndex local_78 [3];
  undefined1 local_60 [16];
  QPoint local_48;
  undefined1 local_40 [16];
  State local_30;
  anon_union_24_3_e3d07ef4_for_data local_28;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_30 = (State)&DAT_aaaaaaaaaaaaaaaa;
  QAccessible::State::State((State *)0x7f9497);
  uVar6 = (**(code **)(*in_RDI + 0x10))();
  if ((uVar6 & 1) != 0) {
    local_40._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_40._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QPointer<QAbstractItemView>::operator->((QPointer<QAbstractItemView> *)0x7f94d7);
    local_40 = (undefined1  [16])QWidget::rect(in_stack_ffffffffffffff08);
    QPointer<QAbstractItemView>::operator->((QPointer<QAbstractItemView> *)0x7f94fd);
    QPoint::QPoint((QPoint *)in_stack_fffffffffffffef0,
                   (int)((ulong)in_stack_fffffffffffffee8 >> 0x20),(int)in_stack_fffffffffffffee8);
    local_48 = QWidget::mapToGlobal
                         ((QWidget *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
                          in_stack_fffffffffffffef8);
    QRect::translate((QRect *)in_stack_fffffffffffffef0,(QPoint *)in_stack_fffffffffffffee8);
    local_60 = (**(code **)(*in_RDI + 0x70))();
    bVar1 = QRect::intersects((QRect *)local_40);
    if (((bVar1 ^ 0xff) & 1) != 0) {
      local_30 = (State)((ulong)local_30 & 0xfffffffffffdffff | 0x20000);
    }
    QPointer<QAbstractItemView>::operator->((QPointer<QAbstractItemView> *)0x7f95a0);
    pQVar7 = QAbstractItemView::selectionModel((QAbstractItemView *)in_stack_fffffffffffffef0);
    QPersistentModelIndex::operator_cast_to_QModelIndex(local_78);
    uVar6 = QItemSelectionModel::isSelected((QModelIndex *)pQVar7);
    if ((uVar6 & 1) != 0) {
      local_30 = (State)((ulong)local_30 & 0xfffffffffffffffd | 2);
    }
    QPointer<QAbstractItemView>::operator->((QPointer<QAbstractItemView> *)0x7f95fd);
    QAbstractItemView::selectionModel((QAbstractItemView *)in_stack_fffffffffffffef0);
    QItemSelectionModel::currentIndex();
    bVar2 = ::operator==(in_stack_fffffffffffffef0,
                         (QPersistentModelIndex *)in_stack_fffffffffffffee8);
    if (bVar2) {
      local_30 = (State)((ulong)local_30 & 0xfffffffffffffff7 | 8);
    }
    local_28.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_28._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QPersistentModelIndex::data((int)&local_28);
    iVar3 = ::QVariant::toInt((bool *)local_28.data);
    if (iVar3 == 2) {
      local_30 = (State)((ulong)local_30 & 0xffffffffffffffbf | 0x40);
    }
    local_94 = 0xaaaaaaaa;
    local_94 = QPersistentModelIndex::flags();
    local_98.super_QFlagsStorage<Qt::ItemFlag>.i =
         (QFlagsStorage<Qt::ItemFlag>)
         QFlags<Qt::ItemFlag>::operator&
                   ((QFlags<Qt::ItemFlag> *)in_stack_fffffffffffffef0,
                    (ItemFlag)((ulong)in_stack_fffffffffffffee8 >> 0x20));
    IVar4 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_98);
    uVar9 = false;
    if (IVar4 != 0) {
      uVar9 = ::QVariant::isValid((QVariant *)in_stack_fffffffffffffef0);
    }
    if ((bool)uVar9 != false) {
      local_30 = (State)((ulong)local_30 & 0xffffffffffffffdf | 0x20);
    }
    local_9c.super_QFlagsStorage<Qt::ItemFlag>.i =
         (QFlagsStorage<Qt::ItemFlag>)
         QFlags<Qt::ItemFlag>::operator&
                   ((QFlags<Qt::ItemFlag> *)in_stack_fffffffffffffef0,
                    (ItemFlag)((ulong)in_stack_fffffffffffffee8 >> 0x20));
    IVar4 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_9c);
    if (IVar4 != 0) {
      local_30 = (State)((ulong)local_30 & 0xffffffffffbffffb | 0x400004);
      QPointer<QAbstractItemView>::operator->((QPointer<QAbstractItemView> *)0x7f97ad);
      SVar5 = QAbstractItemView::selectionMode((QAbstractItemView *)in_stack_fffffffffffffef0);
      if (SVar5 == MultiSelection) {
        local_30 = (State)((ulong)local_30 & 0xfffffffffdffffff | 0x2000000);
      }
      QPointer<QAbstractItemView>::operator->((QPointer<QAbstractItemView> *)0x7f97e0);
      SVar5 = QAbstractItemView::selectionMode((QAbstractItemView *)in_stack_fffffffffffffef0);
      if (SVar5 == ExtendedSelection) {
        local_30 = (State)((ulong)local_30 & 0xfffffffffbffffff | 0x4000000);
      }
    }
    if ((int)in_RDI[6] == 0x24) {
      ::QPointer::operator_cast_to_QAbstractItemView_((QPointer<QAbstractItemView> *)0x7f9824);
      this_00 = qobject_cast<QTreeView_const*>((QObject *)0x7f982c);
      pQVar8 = QAbstractItemView::model
                         ((QAbstractItemView *)CONCAT17(uVar9,in_stack_ffffffffffffff00));
      QPersistentModelIndex::operator_cast_to_QModelIndex(local_b8);
      uVar6 = (**(code **)(*(long *)pQVar8 + 0x88))(pQVar8,local_b8);
      if ((uVar6 & 1) != 0) {
        local_30 = (State)((ulong)local_30 & 0xffffffffffffbfff | 0x4000);
      }
      QPersistentModelIndex::operator_cast_to_QModelIndex(local_d0);
      bVar2 = QTreeView::isExpanded(this_00,in_stack_fffffffffffffee8);
      if (bVar2) {
        local_30 = (State)((ulong)local_30 & 0xfffffffffffff7ff | 0x800);
      }
    }
    ::QVariant::~QVariant((QVariant *)&local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_30;
}

Assistant:

QAccessible::State QAccessibleTableCell::state() const
{
    QAccessible::State st;
    if (!isValid())
        return st;

    QRect globalRect = view->rect();
    globalRect.translate(view->mapToGlobal(QPoint(0,0)));
    if (!globalRect.intersects(rect()))
        st.invisible = true;

    if (view->selectionModel()->isSelected(m_index))
        st.selected = true;
    if (view->selectionModel()->currentIndex() == m_index)
        st.focused = true;

    const QVariant checkState = m_index.data(Qt::CheckStateRole);
    if (checkState.toInt() == Qt::Checked)
        st.checked = true;

    Qt::ItemFlags flags = m_index.flags();
    if ((flags & Qt::ItemIsUserCheckable) && checkState.isValid())
        st.checkable = true;
    if (flags & Qt::ItemIsSelectable) {
        st.selectable = true;
        st.focusable = true;
        if (view->selectionMode() == QAbstractItemView::MultiSelection)
            st.multiSelectable = true;
        if (view->selectionMode() == QAbstractItemView::ExtendedSelection)
            st.extSelectable = true;
    }
#if QT_CONFIG(treeview)
    if (m_role == QAccessible::TreeItem) {
        const QTreeView *treeView = qobject_cast<const QTreeView*>(view);
        if (treeView->model()->hasChildren(m_index))
            st.expandable = true;
        if (treeView->isExpanded(m_index))
            st.expanded = true;
    }
#endif
    return st;
}